

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

BlockStatement * slang::ast::BlockStatement::makeEmpty(Compilation *compilation)

{
  Statement *args;
  BlockStatement *pBVar1;
  StatementBlockKind local_1c;
  SourceRange local_18;
  
  args = StatementList::makeEmpty(compilation);
  local_1c = Sequential;
  local_18.startLoc = (SourceLocation)0xffffffffffffffff;
  local_18.endLoc = (SourceLocation)0xffffffffffffffff;
  pBVar1 = BumpAllocator::
           emplace<slang::ast::BlockStatement,slang::ast::Statement&,slang::ast::StatementBlockKind,slang::SourceRange>
                     (&compilation->super_BumpAllocator,args,&local_1c,&local_18);
  return pBVar1;
}

Assistant:

BlockStatement& BlockStatement::makeEmpty(Compilation& compilation) {
    return *compilation.emplace<BlockStatement>(
        StatementList::makeEmpty(compilation), StatementBlockKind::Sequential,
        SourceRange(SourceLocation::NoLocation, SourceLocation::NoLocation));
}